

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_2761c7::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint pNbChannels;
  Channel *pCVar2;
  Slice *pSVar3;
  int iVar4;
  half *phVar5;
  half *phVar6;
  char *pcVar7;
  half *phVar8;
  half *phVar9;
  undefined7 in_register_00000081;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  int pWidth_local;
  int pHeight_local;
  ulong local_140;
  StringVector multiView;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  OutputFile lFile;
  FrameBuffer lOutputFrameBuffer;
  Header header;
  Array2D<Imath_3_2::half> lPixels;
  Array2D<Imath_3_2::half> local_48;
  
  local_140 = CONCAT44(local_140._4_4_,(int)CONCAT71(in_register_00000081,pIsStereo));
  pNbChannels = *(uint *)("\t\tRGBA file to RGBA framebuffer" + (long)(int)pImageType * 4 + 0x1f);
  uVar13 = (ulong)pNbChannels;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  lVar11 = (long)pHeight;
  lVar10 = (long)(int)(pNbChannels * pWidth);
  uVar12 = 0xffffffffffffffff;
  if (-1 < lVar10 * lVar11) {
    uVar12 = lVar10 * lVar11 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  phVar5 = (half *)operator_new__(uVar12);
  lPixels._sizeX = lVar11;
  lPixels._sizeY = lVar10;
  lPixels._data = phVar5;
  fillPixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  if ((char)local_140 == '\0') {
    local_118._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              (&header,pWidth,pHeight,1.0,(Vec2 *)&local_118,1.0,INCREASING_Y,pCompression);
    puVar14 = &(anonymous_namespace)::CHANNEL_NAMES;
    uVar12 = uVar13;
    do {
      pcVar7 = (char *)Imf_3_2::Header::channels();
      pCVar2 = (Channel *)*puVar14;
      Imf_3_2::Channel::Channel((Channel *)&local_118,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar7,pCVar2);
      puVar14 = puVar14 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&multiView,pFilename,&header,iVar4);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    puVar14 = &(anonymous_namespace)::CHANNEL_NAMES;
    phVar6 = phVar5;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = (Slice *)*puVar14;
      Imf_3_2::Slice::Slice
                ((Slice *)&local_118,HALF,(char *)phVar6,(ulong)(pNbChannels * 2),
                 (long)pWidth * (ulong)(pNbChannels * 2),1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar3);
      phVar6 = phVar6 + 1;
      puVar14 = puVar14 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&multiView);
    Imf_3_2::OutputFile::writePixels((int)&multiView);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&multiView);
    Imf_3_2::Header::~Header(&header);
  }
  else {
    phVar6 = (half *)operator_new__(uVar12);
    local_48._sizeX = lVar11;
    local_48._sizeY = lVar10;
    local_48._data = phVar6;
    fillPixels(&pHeight_local,&pWidth_local,&local_48,pNbChannels,true);
    local_118._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              (&header,pWidth,pHeight,1.0,(Vec2 *)&local_118,1.0,INCREASING_Y,pCompression);
    lVar10 = 0;
    uVar12 = uVar13;
    do {
      pcVar7 = (char *)Imf_3_2::Header::channels();
      pCVar2 = *(Channel **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar10);
      Imf_3_2::Channel::Channel((Channel *)&local_118,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar7,pCVar2);
      pcVar7 = (char *)Imf_3_2::Header::channels();
      pCVar2 = *(Channel **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar10);
      Imf_3_2::Channel::Channel((Channel *)&local_118,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar7,pCVar2);
      lVar10 = lVar10 + 8;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_118.field_2;
    local_118.field_2._M_allocated_capacity._0_4_ = 0x68676972;
    local_118.field_2._M_local_buf[4] = 't';
    local_118.field_2._M_local_buf[5] = '\0';
    local_118._M_string_length = 5;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               &local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT26(local_118.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_118.field_2._M_local_buf[5],
                                        CONCAT14(local_118.field_2._M_local_buf[4],
                                                 local_118.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_118.field_2._M_allocated_capacity._0_4_ = 0x7466656c;
    local_118._M_string_length = 4;
    local_118.field_2._M_local_buf[4] = '\0';
    local_118._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               &local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT26(local_118.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_118.field_2._M_local_buf[5],
                                        CONCAT14(local_118.field_2._M_local_buf[4],
                                                 local_118.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::TypedAttribute((vector *)&local_118);
    Imf_3_2::Header::insert((char *)&header,(Attribute *)"multiView");
    Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       *)&local_118);
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile(&lFile,pFilename,&header,iVar4);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar12 = (ulong)(pNbChannels * 2);
    local_140 = (long)pWidth * uVar12;
    lVar10 = 0;
    phVar8 = phVar6;
    phVar9 = phVar5;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar10);
      Imf_3_2::Slice::Slice
                ((Slice *)&local_118,HALF,(char *)phVar9,uVar12,local_140,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar3);
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar10);
      Imf_3_2::Slice::Slice
                ((Slice *)&local_118,HALF,(char *)phVar8,uVar12,local_140,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar3);
      phVar8 = phVar8 + 1;
      lVar10 = lVar10 + 8;
      phVar9 = phVar9 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_2::OutputFile::writePixels((int)&lFile);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_3_2::OutputFile::~OutputFile(&lFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&multiView);
    Imf_3_2::Header::~Header(&header);
    operator_delete__(phVar6);
  }
  operator_delete__(phVar5);
  return;
}

Assistant:

void
writeFile (
    const char  pFilename[],
    int         pHeight,
    int         pWidth,
    EImageType  pImageType,
    bool        pIsStereo,
    Compression pCompression)
{
    const int     lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);

        writePixels (
            pFilename,
            pHeight,
            pWidth,
            lPixels,
            lPixelsLeft,
            lNbChannels,
            pCompression);
    }
    else
    {
        writePixels (
            pFilename, pHeight, pWidth, lPixels, lNbChannels, pCompression);
    }
}